

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::csharp::StringToBase64
                   (string *__return_storage_ptr__,string *input)

{
  char cVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = (char)__return_storage_ptr__;
  for (uVar2 = input->_M_string_length; 2 < uVar2; uVar2 = uVar2 - 3) {
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
  }
  if (uVar2 == 1) {
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
  }
  else {
    if (uVar2 != 2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
  }
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::push_back(cVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string StringToBase64(const std::string& input) {
  std::string result;
  size_t remaining = input.size();
  const unsigned char *src = (const unsigned char*) input.c_str();
  while (remaining > 2) {
    result += base64_chars[src[0] >> 2];
    result += base64_chars[((src[0] & 0x3) << 4) | (src[1] >> 4)];
    result += base64_chars[((src[1] & 0xf) << 2) | (src[2] >> 6)];
    result += base64_chars[src[2] & 0x3f];
    remaining -= 3;
    src += 3;
  }
  switch (remaining) {
    case 2:
      result += base64_chars[src[0] >> 2];
      result += base64_chars[((src[0] & 0x3) << 4) | (src[1] >> 4)];
      result += base64_chars[(src[1] & 0xf) << 2];
      result += '=';
      src += 2;
      break;
    case 1:
      result += base64_chars[src[0] >> 2];
      result += base64_chars[((src[0] & 0x3) << 4)];
      result += '=';
      result += '=';
      src += 1;
      break;
  }
  return result;
}